

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O1

CommImplMPI * __thiscall
adios2::helper::CommImplMPI::Irecv
          (CommImplMPI *this,void *buffer,size_t count,Datatype datatype,int source,int tag,
          string *hint)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  char cVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  undefined4 in_register_0000000c;
  ulong uVar8;
  long *plVar9;
  ompi_request_t *poVar10;
  size_type *psVar11;
  long lVar12;
  char cVar13;
  iterator iVar14;
  ulong uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  MPI_Request mpiReq_1;
  MPI_Request mpiReq;
  string __str;
  string local_118;
  long *local_f8;
  long *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<ompi_request_t*,std::allocator<ompi_request_t*>> *local_c8;
  ompi_request_t *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  size_t local_a0;
  void *local_98;
  ompi_request_t *local_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  char *local_68;
  uint local_60;
  char local_58 [16];
  ulong local_48;
  CommImplMPI *local_40;
  ulong local_38;
  
  uVar15 = CONCAT44(in_register_0000000c,datatype);
  local_a0 = count;
  plVar6 = (long *)operator_new(0x28);
  sVar3 = local_a0;
  lVar1 = *(long *)((anonymous_namespace)::DatatypeToMPI + (long)source * 8);
  *plVar6 = (long)&PTR__CommReqImplMPI_001656a0;
  plVar6[1] = lVar1;
  local_c8 = (vector<ompi_request_t*,std::allocator<ompi_request_t*>> *)(plVar6 + 2);
  plVar6[2] = 0;
  plVar6[3] = 0;
  plVar6[4] = 0;
  local_f8 = plVar6;
  if (uVar15 < 0x7ffe7001) {
    iVar5 = MPI_Irecv(local_a0,datatype,lVar1,tag,(ulong)hint & 0xffffffff,
                      *(undefined8 *)((long)buffer + 8),&local_c0);
    std::operator+(&local_e8," in call to Isend with single batch ",in_stack_00000010);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
    psVar11 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118.field_2._8_8_ = puVar7[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_118._M_string_length = puVar7[1];
    *puVar7 = psVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    anon_unknown_1::CheckMPIReturn(iVar5,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    iVar14._M_current = (ompi_request_t **)plVar6[3];
    if (iVar14._M_current == (ompi_request_t **)plVar6[4]) {
      std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::
      _M_realloc_insert<ompi_request_t*&>(local_c8,iVar14,&local_c0);
      goto LAB_0012e87e;
    }
  }
  else {
    local_38 = uVar15 / 0x7ffe7000;
    local_48 = uVar15 % 0x7ffe7000;
    lVar12 = 0;
    uVar15 = 0;
    local_98 = buffer;
    local_40 = this;
    do {
      iVar5 = MPI_Irecv(sVar3 + lVar12,0x7ffe7000,lVar1,tag,hint._0_4_,
                        *(undefined8 *)((long)local_98 + 8),&local_90);
      cVar13 = '\x01';
      if (9 < uVar15) {
        uVar8 = uVar15;
        cVar4 = '\x04';
        do {
          cVar13 = cVar4;
          if (uVar8 < 100) {
            cVar13 = cVar13 + -2;
            goto LAB_0012e408;
          }
          if (uVar8 < 1000) {
            cVar13 = cVar13 + -1;
            goto LAB_0012e408;
          }
          if (uVar8 < 10000) goto LAB_0012e408;
          bVar2 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
          cVar4 = cVar13 + '\x04';
        } while (bVar2);
        cVar13 = cVar13 + '\x01';
      }
LAB_0012e408:
      local_68 = local_58;
      std::__cxx11::string::_M_construct((ulong)&local_68,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_68,local_60,uVar15);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x15435f);
      local_88 = &local_78;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_78 = *plVar9;
        lStack_70 = plVar6[3];
      }
      else {
        local_78 = *plVar9;
        local_88 = (long *)*plVar6;
      }
      local_80 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
      local_c0 = (ompi_request_t *)&local_b0;
      poVar10 = (ompi_request_t *)(plVar6 + 2);
      if ((ompi_request_t *)*plVar6 == poVar10) {
        local_b0 = *(long *)poVar10;
        lStack_a8 = plVar6[3];
      }
      else {
        local_b0 = *(long *)poVar10;
        local_c0 = (ompi_request_t *)*plVar6;
      }
      local_b8 = plVar6[1];
      *plVar6 = (long)poVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_c0,(ulong)(in_stack_00000010->_M_dataplus)._M_p);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8.field_2._8_8_ = plVar6[3];
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_e8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_118.field_2._M_allocated_capacity = *psVar11;
        local_118.field_2._8_8_ = plVar6[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar11;
        local_118._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_118._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      anon_unknown_1::CheckMPIReturn(iVar5,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if (local_c0 != (ompi_request_t *)&local_b0) {
        operator_delete(local_c0);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88);
      }
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
      iVar14._M_current = (ompi_request_t **)local_f8[3];
      if (iVar14._M_current == (ompi_request_t **)local_f8[4]) {
        std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::
        _M_realloc_insert<ompi_request_t*&>(local_c8,iVar14,&local_90);
      }
      else {
        *iVar14._M_current = local_90;
        local_f8[3] = local_f8[3] + 8;
      }
      this = local_40;
      plVar6 = local_f8;
      lVar12 = lVar12 + 0x7ffe7000;
      uVar15 = uVar15 + 1;
    } while (uVar15 != local_38);
    if (local_48 == 0) goto LAB_0012e87e;
    iVar5 = MPI_Irecv(sVar3 + lVar12,local_48,lVar1,tag,hint._0_4_,
                      *(undefined8 *)((long)local_98 + 8),&local_c0);
    std::operator+(&local_e8,"in call to Irecv remainder batch ",in_stack_00000010);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
    psVar11 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118.field_2._8_8_ = puVar7[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar11;
      local_118._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_118._M_string_length = puVar7[1];
    *puVar7 = psVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    anon_unknown_1::CheckMPIReturn(iVar5,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    iVar14._M_current = (ompi_request_t **)plVar6[3];
    if (iVar14._M_current == (ompi_request_t **)plVar6[4]) {
      std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::
      _M_realloc_insert<ompi_request_t*&>(local_c8,iVar14,&local_c0);
      goto LAB_0012e87e;
    }
  }
  *iVar14._M_current = local_c0;
  plVar6[3] = plVar6[3] + 8;
LAB_0012e87e:
  local_f0 = plVar6;
  adios2::helper::CommImpl::MakeReq(this);
  if (local_f0 != (long *)0x0) {
    (**(code **)(*local_f0 + 8))();
  }
  return this;
}

Assistant:

Comm::Req CommImplMPI::Irecv(void *buffer, size_t count, Datatype datatype, int source, int tag,
                             const std::string &hint) const
{
    auto req = std::unique_ptr<CommReqImplMPI>(new CommReqImplMPI(ToMPI(datatype)));

    if (count > DefaultMaxFileBatchSize)
    {
        const size_t batches = count / DefaultMaxFileBatchSize;
        size_t position = 0;
        for (size_t b = 0; b < batches; ++b)
        {
            int batchSize = static_cast<int>(DefaultMaxFileBatchSize);
            MPI_Request mpiReq;
            CheckMPIReturn(MPI_Irecv(static_cast<char *>(buffer) + position, batchSize,
                                     ToMPI(datatype), source, tag, m_MPIComm, &mpiReq),
                           "in call to Irecv batch " + std::to_string(b) + " " + hint + "\n");
            req->m_MPIReqs.emplace_back(mpiReq);

            position += DefaultMaxFileBatchSize;
        }

        const size_t remainder = count % DefaultMaxFileBatchSize;
        if (remainder > 0)
        {
            int batchSize = static_cast<int>(remainder);
            MPI_Request mpiReq;
            CheckMPIReturn(MPI_Irecv(static_cast<char *>(buffer) + position, batchSize,
                                     ToMPI(datatype), source, tag, m_MPIComm, &mpiReq),
                           "in call to Irecv remainder batch " + hint + "\n");
            req->m_MPIReqs.emplace_back(mpiReq);
        }
    }
    else
    {
        int batchSize = static_cast<int>(count);
        MPI_Request mpiReq;
        CheckMPIReturn(
            MPI_Irecv(buffer, batchSize, ToMPI(datatype), source, tag, m_MPIComm, &mpiReq),
            " in call to Isend with single batch " + hint + "\n");
        req->m_MPIReqs.emplace_back(mpiReq);
    }

    return MakeReq(std::move(req));
}